

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O0

void phyr::workerThreadFunc(int tIndex,shared_ptr<phyr::Barrier> *barrier)

{
  bool bVar1;
  __int_type_conflict1 _Var2;
  element_type *this;
  __shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  string *__stat_loc;
  undefined4 in_EDI;
  long *in_FS_OFFSET;
  int64_t index;
  int64_t indexEnd;
  int64_t indexStart;
  ParallelForLoop *loop;
  unique_lock<std::mutex> lock;
  function<void_(phyr::Point2<int>)> *in_stack_ffffffffffffff38;
  Point2<int> in_stack_ffffffffffffff40;
  atomic<bool> *in_stack_ffffffffffffff48;
  string local_a0 [32];
  Point2<int> local_80;
  char *local_78;
  char *local_70;
  long in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *pcVar3;
  ParallelForLoop *in_stack_ffffffffffffffa8;
  string local_30 [44];
  undefined4 local_4;
  
  __stat_loc = local_30;
  local_4 = in_EDI;
  formatString<char_const*,int,int>
            ((char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
  std::operator<<((ostream *)&std::cout,__stat_loc);
  std::__cxx11::string::~string(local_30);
  *(undefined4 *)(*in_FS_OFFSET + -0x13a8) = local_4;
  this = std::__shared_ptr_access<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x18789b);
  Barrier::wait(this,__stat_loc);
  std::__shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>::reset(in_RSI);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_ffffffffffffff40,
             (mutex_type *)in_stack_ffffffffffffff38);
  while (((shutdownThreads ^ 0xff) & 1) != 0) {
    bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffff48);
    if (bVar1) {
      _Var2 = std::__atomic_base<int>::operator--((__atomic_base<int> *)&reporterCount);
      if (_Var2 == 0) {
        std::condition_variable::notify_one();
      }
      std::condition_variable::wait((unique_lock *)workListCondition);
    }
    else if (workList == (ParallelForLoop *)0x0) {
      std::condition_variable::wait((unique_lock *)workListCondition);
    }
    else {
      pcVar3 = (char *)workList->nextIndex;
      local_70 = pcVar3 + workList->chunkSize;
      in_stack_ffffffffffffffa8 = workList;
      in_stack_ffffffffffffff48 =
           (atomic<bool> *)std::min<long>((long *)&local_70,&workList->maxIndex);
      in_stack_ffffffffffffff98 = *(long *)in_stack_ffffffffffffff48;
      in_stack_ffffffffffffffa8->nextIndex = in_stack_ffffffffffffff98;
      if (in_stack_ffffffffffffffa8->nextIndex == in_stack_ffffffffffffffa8->maxIndex) {
        workList = in_stack_ffffffffffffffa8->next;
      }
      in_stack_ffffffffffffffa8->activeWorkers = in_stack_ffffffffffffffa8->activeWorkers + 1;
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_ffffffffffffff40);
      local_78 = pcVar3;
      in_stack_ffffffffffffffa0 = local_78;
      for (; (long)local_78 < in_stack_ffffffffffffff98; local_78 = local_78 + 1) {
        bVar1 = std::function::operator_cast_to_bool((function<void_(long)> *)0x187a39);
        if (bVar1) {
          std::function<void_(long)>::operator()
                    ((function<void_(long)> *)in_stack_ffffffffffffff40,
                     (long)in_stack_ffffffffffffff38);
        }
        else {
          in_stack_ffffffffffffff40 = (Point2<int>)&in_stack_ffffffffffffffa8->func2D;
          Point2<int>::Point2(&local_80,(int)((long)local_78 % (long)in_stack_ffffffffffffffa8->nX),
                              (int)((long)local_78 / (long)in_stack_ffffffffffffffa8->nX));
          std::function<void_(phyr::Point2<int>)>::operator()
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
        }
      }
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff40);
      in_stack_ffffffffffffffa8->activeWorkers = in_stack_ffffffffffffffa8->activeWorkers + -1;
      bVar1 = ParallelForLoop::finished(in_stack_ffffffffffffffa8);
      if (bVar1) {
        std::condition_variable::notify_all();
      }
    }
  }
  formatString<char_const*,int,int>
            ((char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
  std::operator<<((ostream *)&std::cout,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

static void workerThreadFunc(int tIndex, std::shared_ptr<Barrier> barrier) {
    LOG_INFO_FMT("Started execution in worker thread %d", tIndex);
    ThreadIndex = tIndex;

    // The main thread sets up a barrier so that it can be sure that all
    // workers have called ProfilerWorkerThreadInit() before it continues
    // (and actually starts the profiling system).
    barrier->wait();

    // Release our reference to the Barrier so that it's freed once all of
    // the threads have cleared it.
    barrier.reset();

    std::unique_lock<std::mutex> lock(workListMutex);
    while (!shutdownThreads) {
        if (reportWorkerStats) {
            if (--reporterCount == 0)
                // Once all worker threads have merged their stats, wake up
                // the main thread.
                reportDoneCondition.notify_one();
            // Now sleep again.
            workListCondition.wait(lock);
        } else if (!workList) {
            // Sleep until there are more tasks to run
            workListCondition.wait(lock);
        } else {
            // Get work from _workList_ and run loop iterations
            ParallelForLoop &loop = *workList;

            // Run a chunk of loop iterations for _loop_

            // Find the set of loop iterations to run next
            int64_t indexStart = loop.nextIndex;
            int64_t indexEnd =
                std::min(indexStart + loop.chunkSize, loop.maxIndex);

            // Update _loop_ to reflect iterations this thread will run
            loop.nextIndex = indexEnd;
            if (loop.nextIndex == loop.maxIndex) workList = loop.next;
            loop.activeWorkers++;

            // Run loop indices in _[indexStart, indexEnd)_
            lock.unlock();
            for (int64_t index = indexStart; index < indexEnd; ++index) {
                if (loop.func1D) {
                    loop.func1D(index);
                }
                // Handle other types of loops
                else {
                    ASSERT(loop.func2D);
                    loop.func2D(Point2i(index % loop.nX, index / loop.nX));
                }
            }
            lock.lock();

            // Update _loop_ to reflect completion of iterations
            loop.activeWorkers--;
            if (loop.finished()) workListCondition.notify_all();
        }
    }
    LOG_INFO_FMT("Exiting worker thread %d", tIndex);
}